

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCInst.c
# Opt level: O2

void MCInst_insert0(MCInst *inst,int index,MCOperand *Op)

{
  MCOperand *pMVar1;
  undefined8 uVar2;
  anon_union_8_3_2f11d3b5_for_MCOperand_3 aVar3;
  uchar uVar4;
  undefined3 uVar5;
  MCInst *pMVar6;
  ulong uVar7;
  
  pMVar6 = (MCInst *)(inst->Operands + inst->size);
  for (uVar7 = (ulong)inst->size; (long)index < (long)uVar7; uVar7 = uVar7 - 1) {
    uVar2 = *(undefined8 *)((long)(pMVar6 + 0xffffffffffffffff) + 0x350);
    aVar3 = *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)
             ((long)(pMVar6 + 0xffffffffffffffff) + 0x358);
    pMVar6->OpcodePub = (int)uVar2;
    pMVar6->size = (char)((ulong)uVar2 >> 0x20);
    pMVar6->has_imm = (_Bool)(char)((ulong)uVar2 >> 0x28);
    pMVar6->op1_size = (char)((ulong)uVar2 >> 0x30);
    pMVar6->field_0x7 = (char)((ulong)uVar2 >> 0x38);
    *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)&pMVar6->Opcode = aVar3;
    pMVar6 = (MCInst *)((long)(pMVar6 + 0xffffffffffffffff) + 0x350);
  }
  uVar4 = Op->Kind;
  uVar5 = *(undefined3 *)&Op->field_0x5;
  aVar3 = Op->field_2;
  pMVar1 = inst->Operands + index;
  pMVar1->MachineOperandType = Op->MachineOperandType;
  pMVar1->Kind = uVar4;
  *(undefined3 *)&pMVar1->field_0x5 = uVar5;
  pMVar1->field_2 = aVar3;
  inst->size = inst->size + '\x01';
  return;
}

Assistant:

void MCInst_insert0(MCInst *inst, int index, MCOperand *Op)
{
	int i;

	for(i = inst->size; i > index; i--)
		//memcpy(&(inst->Operands[i]), &(inst->Operands[i-1]), sizeof(MCOperand));
		inst->Operands[i] = inst->Operands[i-1];

	inst->Operands[index] = *Op;
	inst->size++;
}